

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

void sg_update_buffer(sg_buffer buf_id,sg_range *data)

{
  sg_buffer_type sVar1;
  GLuint buffer;
  bool bVar2;
  int iVar3;
  _sg_buffer_t *p_Var4;
  int iVar5;
  GLenum target;
  undefined4 in_register_0000003c;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c51,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  if (((data == (sg_range *)0x0) || (data->ptr == (void *)0x0)) || (data->size == 0)) {
    __assert_fail("data && data->ptr && (data->size > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c52,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  p_Var4 = _sg_lookup_buffer((_sg_pools_t *)CONCAT44(in_register_0000003c,buf_id.id),(uint32_t)data)
  ;
  if (((p_Var4 != (_sg_buffer_t *)0x0) && (data->size != 0)) &&
     ((p_Var4->slot).state == SG_RESOURCESTATE_VALID)) {
    if (data->ptr == (void *)0x0) {
      __assert_fail("buf && data && data->ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3778,
                    "_Bool _sg_validate_update_buffer(const _sg_buffer_t *, const sg_range *)");
    }
    _sg.validate_error = _SG_VALIDATE_SUCCESS;
    if ((p_Var4->cmn).usage == SG_USAGE_IMMUTABLE) {
      _sg.validate_error = _SG_VALIDATE_UPDATEBUF_USAGE;
      puts("sg_update_buffer: cannot update immutable buffer");
    }
    if ((p_Var4->cmn).size < (int)data->size) {
      _sg.validate_error = _SG_VALIDATE_UPDATEBUF_SIZE;
      puts("sg_update_buffer: update size is bigger than buffer size");
    }
    if ((p_Var4->cmn).update_frame_index == _sg.frame_index) {
      _sg.validate_error = _SG_VALIDATE_UPDATEBUF_ONCE;
      puts("sg_update_buffer: only one update allowed per buffer and frame");
    }
    if ((p_Var4->cmn).append_frame_index == _sg.frame_index) {
      _sg.validate_error = _SG_VALIDATE_UPDATEBUF_APPEND;
      puts("sg_update_buffer: cannot call sg_update_buffer and sg_append_buffer in same frame");
    }
    _sg_validate_end();
    if ((ulong)(long)(p_Var4->cmn).size < data->size) {
      __assert_fail("data->size <= (size_t)buf->cmn.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c56,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((p_Var4->cmn).update_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c58,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((p_Var4->cmn).append_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.append_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c5a,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((data->size == 0) || (data->ptr == (void *)0x0)) {
      __assert_fail("buf && data && data->ptr && (data->size > 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cd3,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    sVar1 = (p_Var4->cmn).type;
    iVar5 = (p_Var4->cmn).active_slot + 1;
    iVar3 = 0;
    if (iVar5 < (p_Var4->cmn).num_slots) {
      iVar3 = iVar5;
    }
    (p_Var4->cmn).active_slot = iVar3;
    if (sVar1 == SG_BUFFERTYPE_VERTEXBUFFER) {
      target = 0x8892;
      bVar2 = true;
    }
    else {
      if (sVar1 != SG_BUFFERTYPE_INDEXBUFFER) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                      ,0x12c3,"GLenum _sg_gl_buffer_target(sg_buffer_type)");
      }
      target = 0x8893;
      bVar2 = false;
    }
    if (1 < iVar3) {
      __assert_fail("buf->cmn.active_slot < SG_NUM_INFLIGHT_FRAMES",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cd9,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    buffer = (p_Var4->gl).buf[iVar3];
    if (buffer == 0) {
      __assert_fail("gl_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cdb,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    iVar3 = glGetError();
    if (iVar3 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1cdc,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    if (bVar2) {
      _sg.gl.cache.stored_vertex_buffer = _sg.gl.cache.vertex_buffer;
    }
    else {
      _sg.gl.cache.stored_index_buffer = _sg.gl.cache.index_buffer;
    }
    _sg_gl_cache_bind_buffer(target,buffer);
    glBufferSubData(target,0,data->size,data->ptr);
    _sg_gl_cache_restore_buffer_binding(target);
    iVar3 = glGetError();
    if (iVar3 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x1ce1,"void _sg_gl_update_buffer(_sg_buffer_t *, const sg_range *)");
    }
    (p_Var4->cmn).update_frame_index = _sg.frame_index;
  }
  return;
}

Assistant:

inline void sg_update_buffer(sg_buffer buf_id, const sg_range& data) { return sg_update_buffer(buf_id, &data); }